

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

void readOption(char *option,int argc,char **argv,bool *out)

{
  int iVar1;
  undefined1 *in_RCX;
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  int i;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    if (in_ESI <= local_24) {
      *in_RCX = 0;
      return;
    }
    iVar1 = strcmp(*(char **)(in_RDX + (long)local_24 * 8),in_RDI);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  *in_RCX = 1;
  return;
}

Assistant:

inline void readOption(const char* option, int argc, char** argv, bool& out) {
	for (int i = 0; i < argc; ++i) {
		if (strcmp(argv[i], option) == 0) {
			out = true;
			return;
		}
	}
	out = false;
}